

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

int duckdb_shell_sqlite3_create_function
              (sqlite3 *db,char *zFunctionName,int nArg,int eTextRep,void *pApp,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal)

{
  reference this;
  pointer this_00;
  type context;
  int iVar1;
  size_type __n;
  vector<duckdb::LogicalType,_true> argv_types;
  LogicalType varargs;
  LogicalType local_110;
  LogicalType local_f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_e0;
  scalar_function_t udf_sqlite3;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_a8;
  string local_88;
  LogicalType local_68;
  string fname;
  
  iVar1 = 0x15;
  if (((-2 < nArg) && (zFunctionName != (char *)0x0)) &&
     ((xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 ||
      xFinal != (_func_void_sqlite3_context_ptr *)0x0) ||
      xFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)) {
    std::__cxx11::string::string((string *)&fname,zFunctionName,(allocator *)&udf_sqlite3);
    if (xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
      iVar1 = 0x15;
    }
    else {
      duckdb::SQLiteUDFWrapper::CreateSQLiteScalarFunction(&udf_sqlite3,xFunc,db,pApp);
      duckdb::LogicalType::LogicalType(&varargs,INVALID);
      if (nArg == -1) {
        duckdb::LogicalType::LogicalType((LogicalType *)&argv_types,ANY);
        duckdb::LogicalType::operator=(&varargs,(LogicalType *)&argv_types);
        duckdb::LogicalType::~LogicalType((LogicalType *)&argv_types);
        nArg = 0;
      }
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&argv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                 ,(ulong)(uint)nArg,(allocator_type *)&local_68);
      for (__n = 0; (uint)nArg != __n; __n = __n + 1) {
        duckdb::LogicalType::LogicalType(&local_68,ANY);
        this = duckdb::vector<duckdb::LogicalType,_true>::get<true>(&argv_types,__n);
        duckdb::LogicalType::operator=(this,&local_68);
        duckdb::LogicalType::~LogicalType(&local_68);
      }
      std::__cxx11::string::string((string *)&local_88,(string *)&fname);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_e0,
                 &argv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                );
      duckdb::LogicalType::LogicalType(&local_f8,VARCHAR);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      function(&local_a8,&udf_sqlite3);
      this_00 = duckdb::
                unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
                operator->(&db->con);
      context = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*(&this_00->context);
      duckdb::LogicalType::LogicalType(&local_110,&varargs);
      duckdb::UDFWrapper::RegisterFunction
                (&local_88,(vector<duckdb::LogicalType,_true> *)&local_e0,&local_f8,&local_a8,
                 context,&local_110);
      duckdb::LogicalType::~LogicalType(&local_110);
      std::_Function_base::~_Function_base(&local_a8.super__Function_base);
      duckdb::LogicalType::~LogicalType(&local_f8);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_e0);
      std::__cxx11::string::~string((string *)&local_88);
      std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&argv_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                );
      duckdb::LogicalType::~LogicalType(&varargs);
      std::_Function_base::~_Function_base(&udf_sqlite3.super__Function_base);
      iVar1 = 0;
    }
    std::__cxx11::string::~string((string *)&fname);
  }
  return iVar1;
}

Assistant:

int sqlite3_create_function(sqlite3 *db, const char *zFunctionName, int nArg, int eTextRep, void *pApp,
                            void (*xFunc)(sqlite3_context *, int, sqlite3_value **),
                            void (*xStep)(sqlite3_context *, int, sqlite3_value **),
                            void (*xFinal)(sqlite3_context *)) {
	if ((!xFunc && !xStep && !xFinal) || !zFunctionName || nArg < -1) {
		return SQLITE_MISUSE;
	}
	string fname = string(zFunctionName);

	// Scalar function
	if (!xFunc) {
		return SQLITE_MISUSE;
	}
	auto udf_sqlite3 = SQLiteUDFWrapper::CreateSQLiteScalarFunction(xFunc, db, pApp);
	LogicalType varargs = LogicalType::INVALID;
	if (nArg == -1) {
		varargs = LogicalType::ANY;
		nArg = 0;
	}

	duckdb::vector<LogicalType> argv_types(nArg);
	for (idx_t i = 0; i < (idx_t)nArg; ++i) {
		argv_types[i] = LogicalType::ANY;
	}

	UDFWrapper::RegisterFunction(fname, argv_types, LogicalType::VARCHAR, udf_sqlite3, *(db->con->context), varargs);
	return SQLITE_OK;
}